

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O2

void __thiscall
MixSegmentTest_TestMultiUserDict_Test::TestBody(MixSegmentTest_TestMultiUserDict_Test *this)

{
  pointer this_00;
  pointer begin;
  string *in_R8;
  char *message;
  allocator<char> local_181;
  AssertHelper local_180;
  AssertionResult gtest_ar;
  string local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string res;
  MixSegment segment;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&res,"../test/testdata/extra_dict/jieba.dict.small.utf8",
             (allocator<char> *)&words);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"../dict/hmm_model.utf8",(allocator<char> *)&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"../test/testdata/userdict.utf8;../test/testdata/userdict.2.utf8",
             &local_181);
  cppjieba::MixSegment::MixSegment(&segment,&res,(string *)&gtest_ar,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&res);
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,anon_var_dwarf_87b1a,(allocator<char> *)&local_158);
  cppjieba::MixSegment::Cut(&segment,(string *)&gtest_ar,&words);
  std::__cxx11::string::~string((string *)&gtest_ar);
  begin = words.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = words.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"/",(allocator<char> *)&local_180);
  limonp::
  Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)&gtest_ar,(limonp *)this_00,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )begin,&local_158,in_R8);
  std::__cxx11::string::operator=((string *)&res,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&local_158);
  testing::internal::CmpHelperEQ<char[48],std::__cxx11::string>
            ((internal *)&gtest_ar,anon_var_dwarf_87c13,"res",&anon_var_dwarf_87c1e,&res);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_158);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
               ,0x85,message);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_158);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&res);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&words);
  cppjieba::MixSegment::~MixSegment(&segment);
  return;
}

Assistant:

TEST(MixSegmentTest, TestMultiUserDict) {
  MixSegment segment("../test/testdata/extra_dict/jieba.dict.small.utf8", "../dict/hmm_model.utf8", 
        "../test/testdata/userdict.utf8;../test/testdata/userdict.2.utf8");
  vector<string> words;
  string res;

  segment.Cut("忽如一夜春风来，千树万树梨花开", words);
  res = limonp::Join(words.begin(), words.end(), "/");
  ASSERT_EQ("忽如一夜春风来/，/千树万树梨花开", res);
}